

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfasttext.cc
# Opt level: O1

fasttext_autotune_t * cft_autotune_new(fasttext_t *handle)

{
  Autotune *this;
  shared_ptr<fasttext::FastText> ft_ptr;
  shared_ptr<fasttext::FastText> local_20;
  
  local_20.super___shared_ptr<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)handle;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<fasttext::FastText*>
            (&local_20.super___shared_ptr<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(FastText *)handle);
  this = (Autotune *)operator_new(0x40);
  fasttext::Autotune::Autotune(this,&local_20);
  if (local_20.super___shared_ptr<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.super___shared_ptr<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return (fasttext_autotune_t *)this;
}

Assistant:

fasttext_autotune_t* cft_autotune_new(fasttext_t *handle) {
    FastText* ft = (FastText*)handle;
    std::shared_ptr<FastText> ft_ptr(ft);
    return (fasttext_autotune_t*)(new Autotune(ft_ptr));
}